

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int normal_prologTok(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  char cVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  uint *puVar5;
  char **ppcVar6;
  long lVar7;
  uint uVar8;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *pcVar10;
  long lVar11;
  byte *pbVar12;
  byte *pbVar13;
  int local_3c;
  uint uVar9;
  
  if (end <= ptr) {
    return -4;
  }
  bVar3 = false;
  iVar4 = 0;
  lVar11 = 1;
  puVar5 = &switchD_00460af3::switchdataD_005db720;
  switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*ptr)) {
  case 2:
    pbVar13 = (byte *)(ptr + 1);
    if ((byte *)end != pbVar13 && -1 < (long)end - (long)pbVar13) {
      bVar2 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar13);
      switch(bVar2) {
      case 0xf:
        iVar4 = normal_scanPi(enc,ptr + 2,end,nextTokPtr);
        return iVar4;
      case 0x10:
        iVar4 = normal_scanDecl(enc,ptr + 2,end,nextTokPtr);
        return iVar4;
      case 0x11:
      case 0x12:
      case 0x13:
      case 0x14:
      case 0x15:
      case 0x17:
        goto switchD_00460eca_default;
      case 0x16:
      case 0x18:
switchD_00460ea1_caseD_16:
        *nextTokPtr = ptr;
        return 0x1d;
      default:
        if ((bVar2 - 5 < 3) || (bVar2 == 0x1d)) goto switchD_00460ea1_caseD_16;
switchD_00460eca_default:
        *nextTokPtr = ptr + 1;
        return 0;
      }
    }
    goto LAB_00460e3c;
  default:
    *nextTokPtr = ptr;
    break;
  case 4:
    pcVar10 = ptr + 1;
    if ((long)end - (long)pcVar10 < 1) {
      iVar4 = -0x1a;
    }
    else {
      if (*pcVar10 == ']') {
        if ((long)end - (long)pcVar10 == 1) {
          return -1;
        }
        if (ptr[2] == '>') {
          *nextTokPtr = ptr + 3;
          return 0x22;
        }
      }
      *nextTokPtr = pcVar10;
      iVar4 = 0x1a;
    }
    break;
  case 5:
    if ((long)end - (long)ptr < 2) {
      return -2;
    }
    iVar4 = (*enc[3].literalScanners[0])
                      (enc,ptr,end,(char **)&switchD_00460af3::switchdataD_005db720);
    lVar11 = 2;
    if (iVar4 != 0) {
LAB_00460d41:
      local_3c = 0x12;
      bVar3 = false;
      goto LAB_00460eff;
    }
    iVar4 = (*enc[3].scanners[0])(enc,ptr,extraout_RDX,(char **)puVar5);
    goto LAB_00460ee7;
  case 6:
    if ((long)end - (long)ptr < 3) {
      return -2;
    }
    iVar4 = (*enc[3].literalScanners[1])
                      (enc,ptr,end,(char **)&switchD_00460af3::switchdataD_005db720);
    lVar11 = 3;
    if (iVar4 != 0) goto LAB_00460d41;
    iVar4 = (*enc[3].scanners[1])(enc,ptr,extraout_RDX_01,(char **)puVar5);
    goto LAB_00460ee7;
  case 7:
    if ((long)end - (long)ptr < 4) {
      return -2;
    }
    iVar4 = (*enc[3].nameMatchesAscii)(enc,ptr,end,(char *)&switchD_00460af3::switchdataD_005db720);
    lVar11 = 4;
    if (iVar4 != 0) goto LAB_00460d41;
    iVar4 = (*enc[3].scanners[2])(enc,ptr,extraout_RDX_00,(char **)puVar5);
LAB_00460ee7:
    if (iVar4 == 0) {
      *nextTokPtr = ptr;
      return 0;
    }
    local_3c = 0x13;
    bVar3 = true;
LAB_00460eff:
    pbVar13 = (byte *)(ptr + lVar11);
    do {
      lVar11 = (long)end - (long)pbVar13;
      if (lVar11 < 1) {
        return -local_3c;
      }
      uVar9 = (uint)*(byte *)((long)enc[1].scanners + (ulong)*pbVar13);
      uVar8 = uVar9 - 5;
      if (0x1f < uVar8) goto switchD_00460f3d_caseD_8;
      lVar7 = 1;
      pcVar10 = (char *)((long)&switchD_00460f3d::switchdataD_005db7ac +
                        (long)(int)(&switchD_00460f3d::switchdataD_005db7ac)[uVar8]);
      switch(uVar9) {
      case 5:
        if (lVar11 == 1) {
          return -2;
        }
        iVar4 = (*enc[3].scanners[0])(enc,(char *)pbVar13,pcVar10,(char **)0x1);
        lVar7 = 2;
        break;
      case 6:
        if (lVar11 < 3) {
          return -2;
        }
        iVar4 = (*enc[3].scanners[1])(enc,(char *)pbVar13,pcVar10,(char **)0x1);
        lVar7 = 3;
        break;
      case 7:
        if (lVar11 < 4) {
          return -2;
        }
        iVar4 = (*enc[3].scanners[2])(enc,(char *)pbVar13,pcVar10,(char **)0x1);
        lVar7 = 4;
        break;
      default:
        goto switchD_00460f3d_caseD_8;
      case 9:
      case 10:
      case 0xb:
      case 0x14:
      case 0x15:
      case 0x1e:
      case 0x20:
      case 0x23:
      case 0x24:
        *nextTokPtr = (char *)pbVar13;
        return local_3c;
      case 0xf:
        if (!bVar3) {
          *nextTokPtr = (char *)(pbVar13 + 1);
          return 0x1e;
        }
        goto switchD_00460f3d_caseD_8;
      case 0x16:
      case 0x18:
      case 0x19:
      case 0x1a:
      case 0x1b:
        goto switchD_00460f3d_caseD_16;
      case 0x21:
        if (!bVar3) {
          *nextTokPtr = (char *)(pbVar13 + 1);
          return 0x1f;
        }
        goto switchD_00460f3d_caseD_8;
      case 0x22:
        if (!bVar3) {
          *nextTokPtr = (char *)(pbVar13 + 1);
          return 0x20;
        }
        goto switchD_00460f3d_caseD_8;
      }
      if (iVar4 == 0) goto switchD_00460f3d_caseD_8;
switchD_00460f3d_caseD_16:
      pbVar13 = pbVar13 + lVar7;
    } while( true );
  case 9:
    if (ptr + 1 == end) {
      *nextTokPtr = end;
      return -0xf;
    }
  case 10:
  case 0x15:
    pbVar13 = (byte *)(ptr + 1);
    lVar11 = (long)end - (long)pbVar13;
    pbVar12 = pbVar13;
    for (; (0 < lVar11 &&
           (((cVar1 = *(char *)((long)enc[1].scanners + (ulong)*pbVar13), cVar1 == '\x15' ||
             (cVar1 == '\n')) ||
            ((pbVar12 = pbVar13, cVar1 == '\t' && (pbVar13 + 1 != (byte *)end))))));
        pbVar13 = pbVar13 + 1) {
      lVar11 = lVar11 + -1;
      pbVar12 = (byte *)end;
    }
    *nextTokPtr = (char *)pbVar12;
    iVar4 = 0xf;
    break;
  case 0xb:
    *nextTokPtr = ptr + 1;
    iVar4 = 0x11;
    break;
  case 0xc:
    iVar4 = 0xc;
    goto LAB_00460db6;
  case 0xd:
    iVar4 = 0xd;
LAB_00460db6:
    iVar4 = normal_scanLit(iVar4,enc,ptr + 1,end,nextTokPtr);
    return iVar4;
  case 0x13:
    pbVar13 = (byte *)(ptr + 1);
    lVar11 = (long)end - (long)pbVar13;
    if (0 < lVar11) {
      ppcVar6 = (char **)(ulong)*pbVar13;
      bVar2 = *(byte *)((long)enc[1].scanners + (long)ppcVar6);
      pcVar10 = (char *)(ulong)bVar2;
      if (bVar2 < 0x16) {
        if (bVar2 == 5) {
          if (lVar11 == 1) {
            return -2;
          }
          iVar4 = (*enc[3].literalScanners[0])(enc,(char *)pbVar13,pcVar10,ppcVar6);
          lVar11 = 3;
        }
        else if (bVar2 == 6) {
          if (lVar11 < 3) {
            return -2;
          }
          iVar4 = (*enc[3].literalScanners[1])(enc,(char *)pbVar13,pcVar10,ppcVar6);
          lVar11 = 4;
        }
        else {
          if (bVar2 != 7) goto LAB_00461157;
          if (lVar11 < 4) {
            return -2;
          }
          iVar4 = (*enc[3].nameMatchesAscii)(enc,(char *)pbVar13,pcVar10,(char *)ppcVar6);
          lVar11 = 5;
        }
        if (iVar4 != 0) {
LAB_0046107f:
          pbVar13 = (byte *)(ptr + lVar11);
          while( true ) {
            lVar11 = (long)end - (long)pbVar13;
            if (lVar11 < 1) {
              return -0x14;
            }
            uVar9 = (uint)*(byte *)((long)enc[1].scanners + (ulong)*pbVar13);
            uVar8 = uVar9 - 5;
            if (0x1f < uVar8) break;
            lVar7 = 1;
            pcVar10 = (char *)((long)&switchD_004610c2::switchdataD_005db82c +
                              (long)(int)(&switchD_004610c2::switchdataD_005db82c)[uVar8]);
            switch(uVar9) {
            case 5:
              if (lVar11 == 1) {
                return -2;
              }
              iVar4 = (*enc[3].scanners[0])(enc,(char *)pbVar13,pcVar10,(char **)0x1);
              lVar7 = 2;
              break;
            case 6:
              if (lVar11 < 3) {
                return -2;
              }
              iVar4 = (*enc[3].scanners[1])(enc,(char *)pbVar13,pcVar10,(char **)0x1);
              lVar7 = 3;
              break;
            case 7:
              if (lVar11 < 4) {
                return -2;
              }
              iVar4 = (*enc[3].scanners[2])(enc,(char *)pbVar13,pcVar10,(char **)0x1);
              lVar7 = 4;
              break;
            default:
              goto switchD_00460f3d_caseD_8;
            case 9:
            case 10:
            case 0xb:
            case 0x15:
            case 0x1e:
            case 0x20:
            case 0x24:
              *nextTokPtr = (char *)pbVar13;
              return 0x14;
            case 0x16:
            case 0x18:
            case 0x19:
            case 0x1a:
            case 0x1b:
              goto switchD_004610c2_caseD_16;
            }
            if (iVar4 == 0) break;
switchD_004610c2_caseD_16:
            pbVar13 = pbVar13 + lVar7;
          }
switchD_00460f3d_caseD_8:
          *nextTokPtr = (char *)pbVar13;
          return 0;
        }
      }
      else {
        lVar11 = 2;
        if ((bVar2 == 0x16) || (bVar2 == 0x18)) goto LAB_0046107f;
      }
LAB_00461157:
      *nextTokPtr = (char *)pbVar13;
      return 0;
    }
LAB_00460e3c:
    iVar4 = -1;
    break;
  case 0x14:
    *nextTokPtr = ptr + 1;
    iVar4 = 0x19;
    break;
  case 0x16:
  case 0x18:
    local_3c = 0x12;
    goto LAB_00460eff;
  case 0x19:
  case 0x1a:
  case 0x1b:
    local_3c = 0x13;
    bVar3 = true;
    goto LAB_00460eff;
  case 0x1e:
    iVar4 = normal_scanPercent(enc,ptr + 1,end,nextTokPtr);
    return iVar4;
  case 0x1f:
    *nextTokPtr = ptr + 1;
    iVar4 = 0x17;
    break;
  case 0x20:
    pbVar13 = (byte *)(ptr + 1);
    if ((byte *)end == pbVar13 || (long)end - (long)pbVar13 < 0) {
      return -0x18;
    }
    bVar2 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar13);
    if (bVar2 < 0x20) {
      if (2 < bVar2 - 9) {
        if (bVar2 == 0xf) {
          *nextTokPtr = ptr + 2;
          return 0x23;
        }
        if (bVar2 != 0x15) goto switchD_00460eca_default;
      }
switchD_00460eca_caseD_20:
      *nextTokPtr = (char *)pbVar13;
      iVar4 = 0x18;
    }
    else {
      switch(bVar2) {
      case 0x20:
      case 0x23:
      case 0x24:
        goto switchD_00460eca_caseD_20;
      case 0x21:
        *nextTokPtr = ptr + 2;
        iVar4 = 0x24;
        break;
      case 0x22:
        *nextTokPtr = ptr + 2;
        iVar4 = 0x25;
        break;
      default:
        goto switchD_00460eca_default;
      }
    }
    break;
  case 0x23:
    *nextTokPtr = ptr + 1;
    iVar4 = 0x26;
    break;
  case 0x24:
    *nextTokPtr = ptr + 1;
    iVar4 = 0x15;
  }
  return iVar4;
}

Assistant:

static int PTRCALL
PREFIX(prologTok)(const ENCODING *enc, const char *ptr, const char *end,
                  const char **nextTokPtr)
{
  int tok;
  if (ptr >= end)
    return XML_TOK_NONE;
  if (MINBPC(enc) > 1) {
    size_t n = end - ptr;
    if (n & (MINBPC(enc) - 1)) {
      n &= ~(MINBPC(enc) - 1);
      if (n == 0)
        return XML_TOK_PARTIAL;
      end = ptr + n;
    }
  }
  switch (BYTE_TYPE(enc, ptr)) {
  case BT_QUOT:
    return PREFIX(scanLit)(BT_QUOT, enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_APOS:
    return PREFIX(scanLit)(BT_APOS, enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_LT:
    {
      ptr += MINBPC(enc);
      REQUIRE_CHAR(enc, ptr, end);
      switch (BYTE_TYPE(enc, ptr)) {
      case BT_EXCL:
        return PREFIX(scanDecl)(enc, ptr + MINBPC(enc), end, nextTokPtr);
      case BT_QUEST:
        return PREFIX(scanPi)(enc, ptr + MINBPC(enc), end, nextTokPtr);
      case BT_NMSTRT:
      case BT_HEX:
      case BT_NONASCII:
      case BT_LEAD2:
      case BT_LEAD3:
      case BT_LEAD4:
        *nextTokPtr = ptr - MINBPC(enc);
        return XML_TOK_INSTANCE_START;
      }
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  case BT_CR:
    if (ptr + MINBPC(enc) == end) {
      *nextTokPtr = end;
      /* indicate that this might be part of a CR/LF pair */
      return -XML_TOK_PROLOG_S;
    }
    /* fall through */
  case BT_S: case BT_LF:
    for (;;) {
      ptr += MINBPC(enc);
      if (! HAS_CHAR(enc, ptr, end))
        break;
      switch (BYTE_TYPE(enc, ptr)) {
      case BT_S: case BT_LF:
        break;
      case BT_CR:
        /* don't split CR/LF pair */
        if (ptr + MINBPC(enc) != end)
          break;
        /* fall through */
      default:
        *nextTokPtr = ptr;
        return XML_TOK_PROLOG_S;
      }
    }
    *nextTokPtr = ptr;
    return XML_TOK_PROLOG_S;
  case BT_PERCNT:
    return PREFIX(scanPercent)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_COMMA:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_COMMA;
  case BT_LSQB:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_OPEN_BRACKET;
  case BT_RSQB:
    ptr += MINBPC(enc);
    if (! HAS_CHAR(enc, ptr, end))
      return -XML_TOK_CLOSE_BRACKET;
    if (CHAR_MATCHES(enc, ptr, ASCII_RSQB)) {
      REQUIRE_CHARS(enc, ptr, end, 2);
      if (CHAR_MATCHES(enc, ptr + MINBPC(enc), ASCII_GT)) {
        *nextTokPtr = ptr + 2*MINBPC(enc);
        return XML_TOK_COND_SECT_CLOSE;
      }
    }
    *nextTokPtr = ptr;
    return XML_TOK_CLOSE_BRACKET;
  case BT_LPAR:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_OPEN_PAREN;
  case BT_RPAR:
    ptr += MINBPC(enc);
    if (! HAS_CHAR(enc, ptr, end))
      return -XML_TOK_CLOSE_PAREN;
    switch (BYTE_TYPE(enc, ptr)) {
    case BT_AST:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_CLOSE_PAREN_ASTERISK;
    case BT_QUEST:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_CLOSE_PAREN_QUESTION;
    case BT_PLUS:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_CLOSE_PAREN_PLUS;
    case BT_CR: case BT_LF: case BT_S:
    case BT_GT: case BT_COMMA: case BT_VERBAR:
    case BT_RPAR:
      *nextTokPtr = ptr;
      return XML_TOK_CLOSE_PAREN;
    }
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  case BT_VERBAR:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_OR;
  case BT_GT:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_DECL_CLOSE;
  case BT_NUM:
    return PREFIX(scanPoundName)(enc, ptr + MINBPC(enc), end, nextTokPtr);
#define LEAD_CASE(n) \
  case BT_LEAD ## n: \
    if (end - ptr < n) \
      return XML_TOK_PARTIAL_CHAR; \
    if (IS_NMSTRT_CHAR(enc, ptr, n)) { \
      ptr += n; \
      tok = XML_TOK_NAME; \
      break; \
    } \
    if (IS_NAME_CHAR(enc, ptr, n)) { \
      ptr += n; \
      tok = XML_TOK_NMTOKEN; \
      break; \
    } \
    *nextTokPtr = ptr; \
    return XML_TOK_INVALID;
    LEAD_CASE(2) LEAD_CASE(3) LEAD_CASE(4)
#undef LEAD_CASE
  case BT_NMSTRT:
  case BT_HEX:
    tok = XML_TOK_NAME;
    ptr += MINBPC(enc);
    break;
  case BT_DIGIT:
  case BT_NAME:
  case BT_MINUS:
#ifdef XML_NS
  case BT_COLON:
#endif
    tok = XML_TOK_NMTOKEN;
    ptr += MINBPC(enc);
    break;
  case BT_NONASCII:
    if (IS_NMSTRT_CHAR_MINBPC(enc, ptr)) {
      ptr += MINBPC(enc);
      tok = XML_TOK_NAME;
      break;
    }
    if (IS_NAME_CHAR_MINBPC(enc, ptr)) {
      ptr += MINBPC(enc);
      tok = XML_TOK_NMTOKEN;
      break;
    }
    /* fall through */
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_GT: case BT_RPAR: case BT_COMMA:
    case BT_VERBAR: case BT_LSQB: case BT_PERCNT:
    case BT_S: case BT_CR: case BT_LF:
      *nextTokPtr = ptr;
      return tok;
#ifdef XML_NS
    case BT_COLON:
      ptr += MINBPC(enc);
      switch (tok) {
      case XML_TOK_NAME:
        REQUIRE_CHAR(enc, ptr, end);
        tok = XML_TOK_PREFIXED_NAME;
        switch (BYTE_TYPE(enc, ptr)) {
        CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
        default:
          tok = XML_TOK_NMTOKEN;
          break;
        }
        break;
      case XML_TOK_PREFIXED_NAME:
        tok = XML_TOK_NMTOKEN;
        break;
      }
      break;
#endif
    case BT_PLUS:
      if (tok == XML_TOK_NMTOKEN)  {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_NAME_PLUS;
    case BT_AST:
      if (tok == XML_TOK_NMTOKEN)  {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_NAME_ASTERISK;
    case BT_QUEST:
      if (tok == XML_TOK_NMTOKEN)  {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_NAME_QUESTION;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return -tok;
}